

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popthelp.c
# Opt level: O0

void itemHelp(FILE *fp,poptItem items,int nitems,columns_t columns,char *translation_domain)

{
  poptOption *opt;
  poptItem ppStack_38;
  int i;
  poptItem item;
  char *translation_domain_local;
  columns_t columns_local;
  int nitems_local;
  poptItem items_local;
  FILE *fp_local;
  
  if (items != (poptItem)0x0) {
    ppStack_38 = items;
    for (opt._4_4_ = 0; opt._4_4_ < nitems; opt._4_4_ = opt._4_4_ + 1) {
      if ((((ppStack_38->option).longName != (char *)0x0) ||
          ((ppStack_38->option).shortName != '\0')) &&
         (((ppStack_38->option).argInfo & 0x40000000) == 0)) {
        singleOptionHelp(fp,columns,&ppStack_38->option,translation_domain);
      }
      ppStack_38 = ppStack_38 + 1;
    }
  }
  return;
}

Assistant:

static void itemHelp(FILE * fp,
		poptItem items, int nitems,
		columns_t columns,
		const char * translation_domain)
{
    poptItem item;
    int i;

    if (items != NULL)
    for (i = 0, item = items; i < nitems; i++, item++) {
	const struct poptOption * opt;
	opt = &item->option;
	if ((opt->longName || opt->shortName) && !F_ISSET(opt, DOC_HIDDEN))
	    singleOptionHelp(fp, columns, opt, translation_domain);
    }
}